

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

saidx64_t * ss_partition(saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t depth)

{
  ulong uVar1;
  bool bVar2;
  saidx64_t t;
  saidx64_t *b;
  saidx64_t *a;
  saidx64_t depth_local;
  saidx64_t *last_local;
  saidx64_t *first_local;
  saidx64_t *PA_local;
  
  a = first + -1;
  b = last;
  while( true ) {
    while( true ) {
      a = a + 1;
      bVar2 = false;
      if (a < b) {
        bVar2 = PA[*a + 1] + 1 <= PA[*a] + depth;
      }
      if (!bVar2) break;
      *a = *a ^ 0xffffffffffffffff;
    }
    do {
      b = b + -1;
      bVar2 = false;
      if (a < b) {
        bVar2 = PA[*b] + depth < PA[*b + 1] + 1;
      }
    } while (bVar2);
    if (b <= a) break;
    uVar1 = *b;
    *b = *a;
    *a = uVar1 ^ 0xffffffffffffffff;
  }
  if (first < a) {
    *first = *first ^ 0xffffffffffffffff;
  }
  return (saidx64_t *)(ulong *)a;
}

Assistant:

static INLINE
saidx_t *
ss_partition(const saidx_t *PA,
                    saidx_t *first, saidx_t *last, saidx_t depth) {
  saidx_t *a, *b;
  saidx_t t;
  for(a = first - 1, b = last;;) {
    for(; (++a < b) && ((PA[*a] + depth) >= (PA[*a + 1] + 1));) { *a = ~*a; }
    for(; (a < --b) && ((PA[*b] + depth) <  (PA[*b + 1] + 1));) { }
    if(b <= a) { break; }
    t = ~*b;
    *b = *a;
    *a = t;
  }
  if(first < a) { *first = ~*first; }
  return a;
}